

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O0

void __thiscall Fossilize::ExternalReplayer::ExternalReplayer(ExternalReplayer *this)

{
  Impl *this_00;
  ExternalReplayer *this_local;
  
  this_00 = (Impl *)operator_new(0x158);
  Impl::Impl(this_00);
  this->impl = this_00;
  return;
}

Assistant:

ExternalReplayer::ExternalReplayer()
{
	impl = new Impl;
}